

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O0

bool __thiscall cppjieba::SegmentBase::ResetSeparators(SegmentBase *this,string *s)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  RuneStr *__x;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  string local_4d8 [32];
  Logger local_4b8;
  _Node_iterator_base<unsigned_int,_false> local_338;
  byte local_330;
  _Node_iterator_base<unsigned_int,_false> local_328;
  byte local_320;
  ulong local_318;
  size_t i;
  Logger local_308;
  undefined1 local_178 [8];
  RuneStrArray runes;
  string *s_local;
  SegmentBase *this_local;
  
  runes.capacity_ = (size_t)s;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->symbols_);
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector((LocalVector<cppjieba::RuneStr> *)local_178);
  bVar2 = DecodeRunesInString((string *)runes.capacity_,(LocalVector<cppjieba::RuneStr> *)local_178)
  ;
  if (bVar2) {
    local_318 = 0;
    while( true ) {
      uVar1 = local_318;
      sVar4 = limonp::LocalVector<cppjieba::RuneStr>::size
                        ((LocalVector<cppjieba::RuneStr> *)local_178);
      if (sVar4 <= uVar1) break;
      __x = limonp::LocalVector<cppjieba::RuneStr>::operator[]
                      ((LocalVector<cppjieba::RuneStr> *)local_178,local_318);
      pVar5 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&this->symbols_,&__x->rune);
      local_338._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_330 = pVar5.second;
      local_328._M_cur = local_338._M_cur;
      local_320 = local_330;
      if (((local_330 ^ 0xff) & 1) != 0) {
        limonp::Logger::Logger
                  (&local_4b8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/SegmentBase.hpp"
                   ,0x22);
        poVar3 = limonp::Logger::Stream(&local_4b8);
        sVar4 = runes.capacity_;
        limonp::LocalVector<cppjieba::RuneStr>::operator[]
                  ((LocalVector<cppjieba::RuneStr> *)local_178,local_318);
        limonp::LocalVector<cppjieba::RuneStr>::operator[]
                  ((LocalVector<cppjieba::RuneStr> *)local_178,local_318);
        std::__cxx11::string::substr((ulong)local_4d8,sVar4);
        poVar3 = std::operator<<(poVar3,local_4d8);
        std::operator<<(poVar3," already exists");
        std::__cxx11::string::~string(local_4d8);
        limonp::Logger::~Logger(&local_4b8);
        this_local._7_1_ = false;
        goto LAB_00115e01;
      }
      local_318 = local_318 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    limonp::Logger::Logger
              (&local_308,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/SegmentBase.hpp"
               ,0x1d);
    poVar3 = limonp::Logger::Stream(&local_308);
    poVar3 = std::operator<<(poVar3,"decode ");
    poVar3 = std::operator<<(poVar3,(string *)runes.capacity_);
    std::operator<<(poVar3," failed");
    limonp::Logger::~Logger(&local_308);
    this_local._7_1_ = false;
  }
LAB_00115e01:
  i._4_4_ = 1;
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector((LocalVector<cppjieba::RuneStr> *)local_178);
  return this_local._7_1_;
}

Assistant:

bool ResetSeparators(const string& s) {
    symbols_.clear();
    RuneStrArray runes;
    if (!DecodeRunesInString(s, runes)) {
      XLOG(ERROR) << "decode " << s << " failed";
      return false;
    }
    for (size_t i = 0; i < runes.size(); i++) {
      if (!symbols_.insert(runes[i].rune).second) {
        XLOG(ERROR) << s.substr(runes[i].offset, runes[i].len) << " already exists";
        return false;
      }
    }
    return true;
  }